

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O0

void post_process_1pass(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                       JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                       JDIMENSION out_rows_avail)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  uint *in_R9;
  JDIMENSION max_rows;
  JDIMENSION num_rows;
  my_post_ptr post;
  uint local_40;
  int local_3c;
  long local_38;
  uint *local_30;
  long local_28;
  long local_8;
  
  local_38 = *(long *)(in_RDI + 0x238);
  local_40 = max_rows - *in_R9;
  if (*(uint *)(local_38 + 0x20) < local_40) {
    local_40 = *(uint *)(local_38 + 0x20);
  }
  local_3c = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_8 = in_RDI;
  (**(code **)(*(long *)(in_RDI + 0x260) + 8))
            (in_RDI,in_RSI,in_RDX,in_ECX,*(undefined8 *)(local_38 + 0x18),&local_3c,local_40);
  (**(code **)(*(long *)(local_8 + 0x270) + 8))
            (local_8,*(undefined8 *)(local_38 + 0x18),local_28 + (ulong)*local_30 * 8,local_3c);
  *local_30 = local_3c + *local_30;
  return;
}

Assistant:

METHODDEF(void)
post_process_1pass(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                   JDIMENSION *in_row_group_ctr,
                   JDIMENSION in_row_groups_avail, JSAMPARRAY output_buf,
                   JDIMENSION *out_row_ctr, JDIMENSION out_rows_avail)
{
  my_post_ptr post = (my_post_ptr)cinfo->post;
  JDIMENSION num_rows, max_rows;

  /* Fill the buffer, but not more than what we can dump out in one go. */
  /* Note we rely on the upsampler to detect bottom of image. */
  max_rows = out_rows_avail - *out_row_ctr;
  if (max_rows > post->strip_height)
    max_rows = post->strip_height;
  num_rows = 0;
  (*cinfo->upsample->upsample) (cinfo, input_buf, in_row_group_ctr,
                                in_row_groups_avail, post->buffer, &num_rows,
                                max_rows);
  /* Quantize and emit data. */
  (*cinfo->cquantize->color_quantize) (cinfo, post->buffer,
                                       output_buf + *out_row_ctr,
                                       (int)num_rows);
  *out_row_ctr += num_rows;
}